

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

char * QScrollerPrivate::stateName(State state)

{
  State state_local;
  char *local_8;
  
  switch(state) {
  case Inactive:
    local_8 = "inactive";
    break;
  case Pressed:
    local_8 = "pressed";
    break;
  case Dragging:
    local_8 = "dragging";
    break;
  case Scrolling:
    local_8 = "scrolling";
    break;
  default:
    local_8 = "(invalid)";
  }
  return local_8;
}

Assistant:

const char *QScrollerPrivate::stateName(QScroller::State state)
{
    switch (state) {
    case QScroller::Inactive:  return "inactive";
    case QScroller::Pressed:   return "pressed";
    case QScroller::Dragging:  return "dragging";
    case QScroller::Scrolling: return "scrolling";
    default:                   return "(invalid)";
    }
}